

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O2

int woff2::NumGlyphs(Font *font)

{
  int iVar1;
  int iVar2;
  Table *pTVar3;
  Table *pTVar4;
  
  pTVar3 = Font::FindTable(font,0x68656164);
  pTVar4 = Font::FindTable(font,0x6c6f6361);
  iVar2 = 0;
  if ((pTVar4 != (Table *)0x0 && pTVar3 != (Table *)0x0) && (iVar2 = 0, 0x33 < pTVar3->length)) {
    iVar1 = IndexFormat(font);
    iVar2 = 0;
    if ((uint)(iVar1 != 0) * 2 + 2 <= pTVar4->length) {
      iVar2 = (pTVar4->length >> (2U - (iVar1 == 0) & 0x1f)) - 1;
    }
  }
  return iVar2;
}

Assistant:

int NumGlyphs(const Font& font) {
  const Font::Table* head_table = font.FindTable(kHeadTableTag);
  const Font::Table* loca_table = font.FindTable(kLocaTableTag);
  if (head_table == NULL || loca_table == NULL || head_table->length < 52) {
    return 0;
  }
  int index_fmt = IndexFormat(font);
  int loca_record_size = (index_fmt == 0 ? 2 : 4);
  if (loca_table->length < loca_record_size) {
    return 0;
  }
  return (loca_table->length / loca_record_size) - 1;
}